

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O3

uint zvgGetDeviceID(uchar *ss,uint idLen,uint *aReadLen)

{
  undefined8 uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  long lVar5;
  uint uVar6;
  uchar *byte;
  uchar *puVar7;
  uchar countLSB;
  uchar countMSB;
  undefined2 local_4a;
  undefined8 local_48;
  uint local_3c;
  uint *local_38;
  
  local_4a = local_4a & 0xff00;
  if ((ZvgIO.ecpFlags & 1) != 0) {
    terminate_1284();
  }
  uVar3 = 0x13;
  if ((1 < idLen) && (((ZvgIO.ecpFlags & 2) != 0 || (uVar3 = negotiate_1284('\x04'), uVar3 == 0))))
  {
    ZvgIO.ecpFlags = ZvgIO.ecpFlags | 2;
    uVar3 = getByteNb((uchar *)((long)&local_4a + 1));
    if ((uVar3 == 0) && (uVar3 = getByteNb((uchar *)&local_4a), uVar3 == 0)) {
      if (local_4a < 3) {
        terminate_1284();
        *ss = '\0';
        *aReadLen = 0;
        uVar3 = 0x13;
      }
      else {
        uVar4 = local_4a - 2;
        uVar6 = idLen - 1;
        if (uVar4 < idLen - 1) {
          uVar6 = uVar4;
        }
        local_48 = 0;
        lVar5 = 0;
        puVar7 = ss;
        local_3c = uVar6;
        local_38 = aReadLen;
        do {
          bVar2 = in((undefined2)ZvgIO.ecpDsr);
          byte = puVar7;
          uVar4 = (uint)lVar5;
          uVar1 = local_48;
          if ((bVar2 & 8) != 0) break;
          byte = ss + lVar5;
          uVar3 = getByteNb(byte);
          uVar1 = CONCAT44(extraout_var,uVar3);
          if (uVar3 != 0) break;
          byte = puVar7 + 1;
          lVar5 = lVar5 + 1;
          puVar7 = byte;
          uVar4 = local_3c;
          uVar1 = local_48;
        } while (uVar6 != (uint)lVar5);
        local_48 = uVar1;
        *byte = '\0';
        *local_38 = uVar4;
        if ((ZvgIO.ecpFlags & 3) != 0) {
          terminate_1284();
        }
        uVar3 = (uint)local_48;
      }
    }
  }
  return uVar3;
}

Assistant:

uint zvgGetDeviceID( uchar *ss, uint idLen, uint *aReadLen)
{
	uint	err, count, readLen;
	uchar	countMSB, countLSB=0;

	// if in ECP mode, terminate first

	if (ZvgIO.ecpFlags & ECPF_ECP)
		terminate_1284();

	if (idLen < 2)
		return (errEcpNoData);				// no room in buffer

	// do a REQ for ID using NIBBLE mode

	if (!(ZvgIO.ecpFlags & ECPF_NIBBLE))
		if ((err = (negotiate_1284( EMODE_REQID_NIBBLE))) != errOk)
			return (err);

	// up to us to set the flag

	ZvgIO.ecpFlags |= ECPF_NIBBLE;		// indicate nibble mode

	// get count word

	err = getByteNb( &countMSB);			// get a byte using nibble mode

	if (!err)
		err = getByteNb( &countLSB);

	// check for error reading first two bytes

	if (err)
		return (err);

	count = (countMSB << 8) + countLSB;

	if (count <= 2)
	{	terminate_1284();
		*ss = '\0';
		*aReadLen = 0;
		return (errEcpNoData);				// no proper ID is given
	}

	count -= 2;									// get number of bytes to read

	// check if it will fit in buffer, leave room for trailing '\0'

	if (count > idLen - 1)
		count = idLen - 1;

	readLen = 0;

	// read string of length 'count' from peripheral using the NIBBLE mode

	while (readLen < count && isDataAvail())
	{
		err = getByteNb( ss);

		if (err)
			break;

		ss++;
		readLen++;
	}
	*ss = '\0';
	*aReadLen = readLen;

	// switch to SPP mode (if not already there because of error)

	zvgSetSppMode();
	return (err);
}